

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall basisu::basisu_frontend::generate_endpoint_clusters(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *parent_codebook;
  uint32_t uVar1;
  job_pool *pjVar2;
  bool bVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint *puVar5;
  uint uVar6;
  vector<unsigned_int> *pvVar7;
  char *__function;
  ulong uVar8;
  uint32_t new_size;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  uchar uVar12;
  uchar uVar13;
  size_t i;
  ulong uVar14;
  uint uVar15;
  undefined8 local_38;
  
  local_38 = in_RAX;
  debug_printf("Begin endpoint quantization\n");
  uVar9 = (this->m_params).m_max_endpoint_clusters;
  uVar15 = 0;
  if ((this->m_params).m_multithreaded == true) {
    uVar4 = std::thread::hardware_concurrency();
    uVar15 = 8;
    if ((int)uVar4 < 8) {
      uVar15 = uVar4;
    }
  }
  pjVar2 = (this->m_params).m_pJob_pool;
  uVar4 = uVar15;
  if ((pjVar2 != (job_pool *)0x0) &&
     (uVar4 = (int)((ulong)((long)(pjVar2->m_threads).
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pjVar2->m_threads).
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + 1,
     (int)uVar15 <= (int)uVar4)) {
    uVar4 = uVar15;
  }
  debug_printf("max_threads: %u\n",(ulong)uVar4);
  parent_codebook = &this->m_endpoint_parent_clusters;
  bVar3 = generate_hierarchical_codebook_threaded<basisu::tree_vector_quant<basisu::vec<6u,float>>>
                    (&this->m_endpoint_clusterizer,(this->m_params).m_max_endpoint_clusters,
                     (uint)(byte)(0xff < uVar9 & this->m_use_hierarchical_endpoint_codebooks) << 4,
                     &this->m_endpoint_clusters,parent_codebook,uVar4,(this->m_params).m_pJob_pool,
                     true);
  if (!bVar3) {
    uVar10 = 0x391;
LAB_00229e41:
    error_printf("basisu_frontend: verify check failed at line %i!\n",uVar10);
    abort();
  }
  if (this->m_use_hierarchical_endpoint_codebooks != true) goto LAB_00229c55;
  if ((this->m_endpoint_parent_clusters).m_size == 0) {
    uVar9 = 0;
    if ((this->m_endpoint_parent_clusters).m_capacity == 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)parent_codebook,1,true,0x10,(object_mover)0x0,false);
      uVar9 = (this->m_endpoint_parent_clusters).m_size;
      if (uVar9 != 1) goto LAB_00229cb7;
    }
    else {
LAB_00229cb7:
      memset(parent_codebook->m_p + uVar9,0,(ulong)(1 - uVar9) << 4);
    }
    (this->m_endpoint_parent_clusters).m_size = 1;
    if (this->m_total_blocks != 0) {
      uVar9 = 0;
      uVar15 = 0;
      do {
        pvVar7 = parent_codebook->m_p;
        local_38 = CONCAT44(uVar9,(uint)local_38);
        puVar5 = pvVar7->m_p;
        uVar4 = pvVar7->m_size;
        uVar14 = (ulong)uVar4;
        if ((uint *)((long)&local_38 + 4U) < puVar5 + uVar14 &&
            (puVar5 <= (uint *)((long)&local_38 + 4U) && puVar5 != (uint *)0x0)) {
LAB_00229e5b:
          __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x267,
                        "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                       );
        }
        uVar6 = uVar9;
        if (pvVar7->m_capacity <= uVar4) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar7,uVar4 + 1,true,4,(object_mover)0x0,false);
          puVar5 = pvVar7->m_p;
          uVar14 = (ulong)pvVar7->m_size;
          uVar6 = local_38._4_4_;
        }
        puVar5[uVar14] = uVar6;
        pvVar7->m_size = pvVar7->m_size + 1;
        if ((this->m_endpoint_parent_clusters).m_size == 0) break;
        pvVar7 = parent_codebook->m_p;
        local_38 = CONCAT44(local_38._4_4_,uVar9 + 1);
        puVar5 = pvVar7->m_p;
        uVar4 = pvVar7->m_size;
        uVar14 = (ulong)uVar4;
        if (&local_38 < puVar5 + uVar14 && (puVar5 <= &local_38 && puVar5 != (uint *)0x0))
        goto LAB_00229e5b;
        uVar6 = uVar9 + 1;
        if (pvVar7->m_capacity <= uVar4) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar7,uVar4 + 1,true,4,(object_mover)0x0,false);
          puVar5 = pvVar7->m_p;
          uVar14 = (ulong)pvVar7->m_size;
          uVar6 = (uint)local_38;
        }
        puVar5[uVar14] = uVar6;
        pvVar7->m_size = pvVar7->m_size + 1;
        uVar15 = uVar15 + 1;
        if (this->m_total_blocks <= uVar15) goto LAB_00229ad2;
        uVar9 = uVar9 + 2;
      } while ((this->m_endpoint_parent_clusters).m_size != 0);
      __function = 
      "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
      ;
LAB_00229e1d:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,__function);
    }
  }
LAB_00229ad2:
  if ((this->m_block_parent_endpoint_cluster).m_size != 0) {
    (this->m_block_parent_endpoint_cluster).m_size = 0;
  }
  uVar9 = this->m_total_blocks;
  if (uVar9 != 0) {
    uVar15 = 0;
    if ((this->m_block_parent_endpoint_cluster).m_capacity < uVar9) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_block_parent_endpoint_cluster,uVar9,uVar9 == 1,1,
                 (object_mover)0x0,false);
      uVar15 = (this->m_block_parent_endpoint_cluster).m_size;
    }
    uVar14 = 0;
    memset((this->m_block_parent_endpoint_cluster).m_p + uVar15,0,(ulong)(uVar9 - uVar15));
    (this->m_block_parent_endpoint_cluster).m_size = uVar9;
    do {
      (this->m_block_parent_endpoint_cluster).m_p[uVar14] = 0xff;
      uVar14 = uVar14 + 1;
    } while (uVar14 < (this->m_block_parent_endpoint_cluster).m_size);
  }
  uVar9 = (this->m_endpoint_parent_clusters).m_size;
  if (uVar9 != 0) {
    uVar14 = 0;
    do {
      if (parent_codebook->m_p[uVar14].m_size != 0) {
        pvVar7 = parent_codebook->m_p + uVar14;
        uVar8 = 0;
        do {
          uVar9 = pvVar7->m_p[uVar8] >> 1;
          if ((this->m_block_parent_endpoint_cluster).m_size <= uVar9) goto LAB_00229e08;
          (this->m_block_parent_endpoint_cluster).m_p[uVar9] = (uchar)uVar14;
          uVar8 = uVar8 + 1;
        } while (uVar8 < pvVar7->m_size);
        uVar9 = (this->m_endpoint_parent_clusters).m_size;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar9);
  }
  if ((ulong)this->m_total_blocks != 0) {
    uVar14 = 0;
    do {
      if ((this->m_block_parent_endpoint_cluster).m_size == uVar14) goto LAB_00229e08;
      if ((this->m_block_parent_endpoint_cluster).m_p[uVar14] == 0xff) {
        uVar10 = 0x3b1;
        goto LAB_00229e41;
      }
      uVar14 = uVar14 + 1;
    } while (this->m_total_blocks != uVar14);
  }
  uVar14 = (ulong)(this->m_endpoint_clusters).m_size;
  if (uVar14 != 0) {
    pvVar7 = (this->m_endpoint_clusters).m_p;
    uVar8 = 0;
    do {
      uVar1 = pvVar7[uVar8].m_size;
      if (uVar1 != 0) {
        lVar11 = 0;
        uVar12 = '\0';
        do {
          uVar9 = pvVar7[uVar8].m_p[lVar11] >> 1;
          if ((this->m_block_parent_endpoint_cluster).m_size <= uVar9) {
            uVar10 = 0x3be;
            goto LAB_00229e41;
          }
          uVar13 = (this->m_block_parent_endpoint_cluster).m_p[uVar9];
          if (((int)lVar11 != 0) && (bVar3 = uVar12 != uVar13, uVar13 = uVar12, bVar3)) {
            uVar10 = 0x3c6;
            goto LAB_00229e41;
          }
          lVar11 = lVar11 + 1;
          uVar12 = uVar13;
        } while (uVar1 != (uint32_t)lVar11);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar14);
  }
LAB_00229c55:
  if ((this->m_params).m_debug_stats == true) {
    debug_printf("Total endpoint clusters: %u, parent clusters: %u\n",
                 (ulong)(this->m_endpoint_clusters).m_size,
                 (ulong)(this->m_endpoint_parent_clusters).m_size);
  }
  return;
LAB_00229e08:
  __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
  goto LAB_00229e1d;
}

Assistant:

void basisu_frontend::generate_endpoint_clusters()
	{
		debug_printf("Begin endpoint quantization\n");

		const uint32_t parent_codebook_size = (m_params.m_max_endpoint_clusters >= 256) ? BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE : 0;
		uint32_t max_threads = 0;
		max_threads = m_params.m_multithreaded ? minimum<int>(std::thread::hardware_concurrency(), cMaxCodebookCreationThreads) : 0;
		if (m_params.m_pJob_pool)
			max_threads = minimum<int>((int)m_params.m_pJob_pool->get_total_threads(), max_threads);

		debug_printf("max_threads: %u\n", max_threads);
		bool status = generate_hierarchical_codebook_threaded(m_endpoint_clusterizer,
			m_params.m_max_endpoint_clusters, m_use_hierarchical_endpoint_codebooks ? parent_codebook_size : 0,
			m_endpoint_clusters,
			m_endpoint_parent_clusters,
			max_threads, m_params.m_pJob_pool, true);
		BASISU_FRONTEND_VERIFY(status);

		if (m_use_hierarchical_endpoint_codebooks)
		{
			if (!m_endpoint_parent_clusters.size())
			{
				m_endpoint_parent_clusters.resize(0);
				m_endpoint_parent_clusters.resize(1);
				for (uint32_t i = 0; i < m_total_blocks; i++)
				{
					m_endpoint_parent_clusters[0].push_back(i*2);
					m_endpoint_parent_clusters[0].push_back(i*2+1);
				}
			}

			BASISU_ASSUME(BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE <= UINT8_MAX);

			m_block_parent_endpoint_cluster.resize(0);
			m_block_parent_endpoint_cluster.resize(m_total_blocks);
			vector_set_all(m_block_parent_endpoint_cluster, 0xFF);
			for (uint32_t parent_cluster_index = 0; parent_cluster_index < m_endpoint_parent_clusters.size(); parent_cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_parent_clusters[parent_cluster_index];
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					m_block_parent_endpoint_cluster[block_index] = static_cast<uint8_t>(parent_cluster_index);
				}
			}

			for (uint32_t i = 0; i < m_total_blocks; i++)
			{
				BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[i] != 0xFF);
			}

			// Ensure that all the blocks within each cluster are all in the same parent cluster, or something is very wrong.
			for (uint32_t cluster_index = 0; cluster_index < m_endpoint_clusters.size(); cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_clusters[cluster_index];
			
				uint32_t parent_cluster_index = 0;
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					
					BASISU_FRONTEND_VERIFY(block_index < m_block_parent_endpoint_cluster.size());

					if (!j)
					{
						parent_cluster_index = m_block_parent_endpoint_cluster[block_index];
					}
					else
					{
						BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[block_index] == parent_cluster_index);
					}
				}
			}
		}
								
		if (m_params.m_debug_stats)
			debug_printf("Total endpoint clusters: %u, parent clusters: %u\n", (uint32_t)m_endpoint_clusters.size(), (uint32_t)m_endpoint_parent_clusters.size());
	}